

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O0

int __thiscall ParallelManager::init(ParallelManager *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  lock_guard<std::mutex> lck;
  mutex_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
             ,in_stack_ffffffffffffffb8);
  if ((this->m_init_done & 1U) == 0) {
    uVar1 = std::function<unsigned_int_()>::operator()
                      ((function<unsigned_int_()> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    this->m_task_count = uVar1;
    this->m_init_done = true;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x54bfd8);
  return extraout_EAX;
}

Assistant:

void init(std::function<unsigned int(void)> init_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_init_done)
		{
			m_task_count = init_func();
			m_init_done = true;
		}
	}